

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_version_test.cpp
# Opt level: O0

void __thiscall
metacall_version_test_DefaultConstructor_Test::TestBody
          (metacall_version_test_DefaultConstructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertionResult *this_00;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  AssertHelper in_stack_ffffffffffffffc0;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_ffffffffffffffc8;
  AssertionResult local_18;
  
  metacall_print_info();
  pcVar2 = (char *)metacall_version_str();
  strcmp("0.8.8",pcVar2);
  this_00 = &local_18;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffffc8._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,(char *)in_stack_ffffffffffffffc0.data_,
             (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10a97d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_version_test/source/metacall_version_test.cpp"
               ,0x22,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&stack0xffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
    testing::Message::~Message((Message *)0x10a9c9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10aa19);
  return;
}

Assistant:

TEST_F(metacall_version_test, DefaultConstructor)
{
	metacall_print_info();

	ASSERT_EQ((int)0, (int)strcmp(METACALL_VERSION, metacall_version_str()));

	/* TODO: Test other version functions */
}